

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

CollSeq * sqlite3ExprCollSeq(Parse *pParse,Expr *pExpr)

{
  char *pcVar1;
  ushort uVar2;
  sqlite3 *psVar3;
  Column *pCVar4;
  ExprList *pEVar5;
  bool bVar6;
  byte bVar7;
  char *pcVar8;
  char *pcVar9;
  HashElem *pHVar10;
  Expr *pEVar11;
  CollSeq *pCVar12;
  long lVar13;
  CollSeq *pColl;
  
  psVar3 = pParse->db;
  pColl = (CollSeq *)0x0;
  do {
    if (pExpr == (Expr *)0x0) break;
    bVar7 = pExpr->op;
    if (bVar7 == 0xb0) {
      bVar7 = pExpr->op2;
    }
    if (bVar7 < 0xa7) {
      if (bVar7 == 0x24) goto LAB_00150bba;
      if (bVar7 == 0x4d) goto LAB_00150af1;
LAB_00150aca:
      if (bVar7 != 0x71) goto LAB_00150bcb;
      pColl = sqlite3GetCollSeq(pParse,psVar3->enc,(CollSeq *)0x0,(pExpr->u).zToken);
      bVar6 = true;
    }
    else {
      if (bVar7 < 0xae) {
        if ((bVar7 != 0xa7) && (bVar7 != 0xa9)) {
LAB_00150bcb:
          bVar6 = true;
          if ((pExpr->flags & 0x200) != 0) {
            pEVar11 = pExpr->pLeft;
            if ((pEVar11 == (Expr *)0x0) || ((pEVar11->flags & 0x200) == 0)) {
              pEVar11 = pExpr->pRight;
              pEVar5 = (pExpr->x).pList;
              if ((pEVar5 != (ExprList *)0x0) &&
                 ((psVar3->mallocFailed == '\0' && (0 < (long)pEVar5->nExpr)))) {
                lVar13 = 0;
                do {
                  pExpr = *(Expr **)((long)&pEVar5->a[0].pExpr + lVar13);
                  if ((pExpr->flags & 0x200) != 0) goto LAB_00150bbe;
                  lVar13 = lVar13 + 0x18;
                } while ((long)pEVar5->nExpr * 0x18 != lVar13);
              }
            }
            bVar6 = false;
            pExpr = pEVar11;
          }
          goto LAB_00150bc0;
        }
LAB_00150af1:
        if ((pExpr->y).pTab != (Table *)0x0) {
          lVar13 = (long)pExpr->iColumn;
          bVar6 = true;
          if (-1 < lVar13) {
            pCVar4 = ((pExpr->y).pTab)->aCol;
            uVar2 = pCVar4[lVar13].colFlags;
            if ((uVar2 >> 9 & 1) == 0) {
              pcVar8 = (char *)0x0;
            }
            else {
              pcVar8 = pCVar4[lVar13].zCnName + -1;
              do {
                pcVar9 = pcVar8 + 1;
                pcVar8 = pcVar8 + 1;
              } while (*pcVar9 != '\0');
              pcVar9 = pcVar8;
              if ((uVar2 & 4) != 0) {
                do {
                  pcVar8 = pcVar9 + 1;
                  pcVar1 = pcVar9 + 1;
                  pcVar9 = pcVar8;
                } while (*pcVar1 != '\0');
              }
              pcVar8 = pcVar8 + 1;
            }
            if (pcVar8 == (char *)0x0) {
              pColl = psVar3->pDfltColl;
            }
            else {
              bVar7 = psVar3->enc;
              pHVar10 = findElementWithHash(&psVar3->aCollSeq,pcVar8,(uint *)0x0);
              if (pHVar10->data == (void *)0x0) {
                pColl = (CollSeq *)0x0;
              }
              else {
                pColl = (CollSeq *)((long)pHVar10->data + (ulong)bVar7 * 0x28 + -0x28);
              }
            }
          }
          goto LAB_00150bc0;
        }
        if (bVar7 < 0xae) {
          if (bVar7 != 0x24) goto LAB_00150aca;
        }
        else {
          if (bVar7 == 0xb1) goto LAB_00150b38;
          if (bVar7 != 0xae) goto LAB_00150bcb;
        }
LAB_00150bba:
        pExpr = pExpr->pLeft;
      }
      else {
        if (bVar7 == 0xae) goto LAB_00150bba;
        if (bVar7 != 0xb1) goto LAB_00150bcb;
LAB_00150b38:
        pExpr = ((pExpr->x).pList)->a[0].pExpr;
      }
LAB_00150bbe:
      bVar6 = false;
    }
LAB_00150bc0:
  } while (!bVar6);
  if (((pColl != (CollSeq *)0x0) &&
      (pColl->xCmp == (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0)) &&
     (pCVar12 = sqlite3GetCollSeq(pParse,pParse->db->enc,pColl,pColl->zName),
     pCVar12 == (CollSeq *)0x0)) {
    pColl = (CollSeq *)0x0;
  }
  return pColl;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3ExprCollSeq(Parse *pParse, const Expr *pExpr){
  sqlite3 *db = pParse->db;
  CollSeq *pColl = 0;
  const Expr *p = pExpr;
  while( p ){
    int op = p->op;
    if( op==TK_REGISTER ) op = p->op2;
    if( op==TK_AGG_COLUMN || op==TK_COLUMN || op==TK_TRIGGER ){
      assert( ExprUseYTab(p) );
      if( p->y.pTab!=0 ){
        /* op==TK_REGISTER && p->y.pTab!=0 happens when pExpr was originally
        ** a TK_COLUMN but was previously evaluated and cached in a register */
        int j = p->iColumn;
        if( j>=0 ){
          const char *zColl = sqlite3ColumnColl(&p->y.pTab->aCol[j]);
          pColl = sqlite3FindCollSeq(db, ENC(db), zColl, 0);
        }
        break;
      }
    }
    if( op==TK_CAST || op==TK_UPLUS ){
      p = p->pLeft;
      continue;
    }
    if( op==TK_VECTOR ){
      assert( ExprUseXList(p) );
      p = p->x.pList->a[0].pExpr;
      continue;
    }
    if( op==TK_COLLATE ){
      assert( !ExprHasProperty(p, EP_IntValue) );
      pColl = sqlite3GetCollSeq(pParse, ENC(db), 0, p->u.zToken);
      break;
    }
    if( p->flags & EP_Collate ){
      if( p->pLeft && (p->pLeft->flags & EP_Collate)!=0 ){
        p = p->pLeft;
      }else{
        Expr *pNext  = p->pRight;
        /* The Expr.x union is never used at the same time as Expr.pRight */
        assert( ExprUseXList(p) );
        assert( p->x.pList==0 || p->pRight==0 );
        if( p->x.pList!=0 && !db->mallocFailed ){
          int i;
          for(i=0; ALWAYS(i<p->x.pList->nExpr); i++){
            if( ExprHasProperty(p->x.pList->a[i].pExpr, EP_Collate) ){
              pNext = p->x.pList->a[i].pExpr;
              break;
            }
          }
        }
        p = pNext;
      }
    }else{
      break;
    }
  }
  if( sqlite3CheckCollSeq(pParse, pColl) ){
    pColl = 0;
  }
  return pColl;
}